

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sentencepiece.pb.cc
# Opt level: O1

void __thiscall
sentencepiece::SentencePieceText_SentencePiece::SentencePieceText_SentencePiece
          (SentencePieceText_SentencePiece *this,Arena *arena)

{
  (this->super_MessageLite)._internal_metadata_.ptr_ = arena;
  (this->super_MessageLite)._vptr_MessageLite =
       (_func_int **)&PTR__SentencePieceText_SentencePiece_002124a8;
  google::protobuf::internal::ExtensionSet::ExtensionSet(&this->_extensions_,arena);
  this->_has_bits_ = (uint32  [1])0x0;
  this->_cached_size_ = (atomic<int>)0x0;
  if (scc_info_SentencePieceText_SentencePiece_sentencepiece_2eproto.base.visit_status.
      super___atomic_base<int>._M_i != 0) {
    google::protobuf::internal::InitSCCImpl
              (&scc_info_SentencePieceText_SentencePiece_sentencepiece_2eproto.base);
  }
  (this->piece_).tagged_ptr_.ptr_ = &google::protobuf::internal::fixed_address_empty_string;
  (this->surface_).tagged_ptr_.ptr_ = &google::protobuf::internal::fixed_address_empty_string;
  this->id_ = 0;
  this->begin_ = 0;
  this->end_ = 0;
  return;
}

Assistant:

SentencePieceText_SentencePiece::SentencePieceText_SentencePiece(::PROTOBUF_NAMESPACE_ID::Arena* arena)
  : ::PROTOBUF_NAMESPACE_ID::MessageLite(arena),
  _extensions_(arena) {
  SharedCtor();
  RegisterArenaDtor(arena);
  // @@protoc_insertion_point(arena_constructor:sentencepiece.SentencePieceText.SentencePiece)
}